

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O1

void __thiscall
chrono::utils::ChISO2631_Vibration_SeatCushionLogger::AddData
          (ChISO2631_Vibration_SeatCushionLogger *this,double speed,double acc_x,double acc_y,
          double acc_z)

{
  double dVar1;
  iterator iVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  
  local_30 = speed;
  local_28 = acc_x;
  local_20 = acc_y;
  local_18 = acc_z;
  local_38 = ChSineStep(this->m_logging_time,this->m_tstart1,0.0,this->m_tstart2,1.0);
  iVar2._M_current =
       (this->m_data_speed).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_data_speed).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&this->m_data_speed,iVar2,&local_30);
  }
  else {
    *iVar2._M_current = local_30;
    (this->m_data_speed).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_40 = local_38 * local_28;
  iVar2._M_current =
       (this->m_data_acc_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_data_acc_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->m_data_acc_x,iVar2,&local_40);
  }
  else {
    *iVar2._M_current = local_40;
    (this->m_data_acc_x).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_40 = local_38 * local_20;
  iVar2._M_current =
       (this->m_data_acc_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_data_acc_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->m_data_acc_y,iVar2,&local_40);
  }
  else {
    *iVar2._M_current = local_40;
    (this->m_data_acc_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_40 = local_38 * local_18;
  iVar2._M_current =
       (this->m_data_acc_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_data_acc_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_38 = local_40;
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->m_data_acc_z,iVar2,&local_40);
    local_40 = local_38;
  }
  else {
    *iVar2._M_current = local_40;
    (this->m_data_acc_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_40 = local_40 * 3.280839895;
  iVar2._M_current =
       (this->m_data_acc_ap_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_data_acc_ap_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->m_data_acc_ap_z,iVar2,&local_40);
  }
  else {
    *iVar2._M_current = local_40;
    (this->m_data_acc_ap_z).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_40 = ChISO2631_1_Wd::Filter
                       (&this->m_filter_wd_x,
                        (this->m_data_acc_x).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1]);
  iVar2._M_current =
       (this->m_data_acc_x_wd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_data_acc_x_wd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->m_data_acc_x_wd,iVar2,&local_40);
  }
  else {
    *iVar2._M_current = local_40;
    (this->m_data_acc_x_wd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_40 = ChISO2631_1_Wd::Filter
                       (&this->m_filter_wd_y,
                        (this->m_data_acc_y).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1]);
  iVar2._M_current =
       (this->m_data_acc_y_wd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_data_acc_y_wd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->m_data_acc_y_wd,iVar2,&local_40);
  }
  else {
    *iVar2._M_current = local_40;
    (this->m_data_acc_y_wd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  local_40 = ChISO2631_1_Wk::Filter
                       (&this->m_filter_wk_z,
                        (this->m_data_acc_z).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1]);
  iVar2._M_current =
       (this->m_data_acc_z_wk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_data_acc_z_wk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->m_data_acc_z_wk,iVar2,&local_40);
  }
  else {
    *iVar2._M_current = local_40;
    (this->m_data_acc_z_wk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  dVar1 = (this->m_data_acc_x_wd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  dVar1 = dVar1 * dVar1;
  dVar3 = (this->m_filter_int_aw_x).m_Ti;
  local_40 = ((dVar1 + (this->m_filter_int_aw_x).super_ChAnalogueFilter.m_u_old) *
             (this->m_filter_int_aw_x).super_ChAnalogueFilter.m_step) / (dVar3 + dVar3) +
             (this->m_filter_int_aw_x).super_ChAnalogueFilter.m_y_old;
  (this->m_filter_int_aw_x).super_ChAnalogueFilter.m_y_old = local_40;
  (this->m_filter_int_aw_x).super_ChAnalogueFilter.m_u_old = dVar1;
  iVar2._M_current =
       (this->m_data_aw_x_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_data_aw_x_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->m_data_aw_x_i,iVar2,&local_40);
  }
  else {
    *iVar2._M_current = local_40;
    (this->m_data_aw_x_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  dVar1 = (this->m_data_acc_y_wd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  dVar1 = dVar1 * dVar1;
  dVar3 = (this->m_filter_int_aw_y).m_Ti;
  local_40 = ((dVar1 + (this->m_filter_int_aw_y).super_ChAnalogueFilter.m_u_old) *
             (this->m_filter_int_aw_y).super_ChAnalogueFilter.m_step) / (dVar3 + dVar3) +
             (this->m_filter_int_aw_y).super_ChAnalogueFilter.m_y_old;
  (this->m_filter_int_aw_y).super_ChAnalogueFilter.m_y_old = local_40;
  (this->m_filter_int_aw_y).super_ChAnalogueFilter.m_u_old = dVar1;
  iVar2._M_current =
       (this->m_data_aw_y_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_data_aw_y_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->m_data_aw_y_i,iVar2,&local_40);
  }
  else {
    *iVar2._M_current = local_40;
    (this->m_data_aw_y_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  dVar1 = (this->m_data_acc_z_wk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish[-1];
  dVar1 = dVar1 * dVar1;
  dVar3 = (this->m_filter_int_aw_z).m_Ti;
  local_40 = ((dVar1 + (this->m_filter_int_aw_z).super_ChAnalogueFilter.m_u_old) *
             (this->m_filter_int_aw_z).super_ChAnalogueFilter.m_step) / (dVar3 + dVar3) +
             (this->m_filter_int_aw_z).super_ChAnalogueFilter.m_y_old;
  (this->m_filter_int_aw_z).super_ChAnalogueFilter.m_y_old = local_40;
  (this->m_filter_int_aw_z).super_ChAnalogueFilter.m_u_old = dVar1;
  iVar2._M_current =
       (this->m_data_aw_z_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_data_aw_z_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->m_data_aw_z_i,iVar2,&local_40);
  }
  else {
    *iVar2._M_current = local_40;
    (this->m_data_aw_z_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  dVar3 = pow((this->m_data_acc_x_wd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish[-1],4.0);
  dVar1 = (this->m_filter_int_vdv_x).m_Ti;
  local_40 = ((dVar3 + (this->m_filter_int_vdv_x).super_ChAnalogueFilter.m_u_old) *
             (this->m_filter_int_vdv_x).super_ChAnalogueFilter.m_step) / (dVar1 + dVar1) +
             (this->m_filter_int_vdv_x).super_ChAnalogueFilter.m_y_old;
  (this->m_filter_int_vdv_x).super_ChAnalogueFilter.m_y_old = local_40;
  (this->m_filter_int_vdv_x).super_ChAnalogueFilter.m_u_old = dVar3;
  iVar2._M_current =
       (this->m_data_vdv_x_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_data_vdv_x_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->m_data_vdv_x_i,iVar2,&local_40);
  }
  else {
    *iVar2._M_current = local_40;
    (this->m_data_vdv_x_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  dVar3 = pow((this->m_data_acc_y_wd).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish[-1],4.0);
  dVar1 = (this->m_filter_int_vdv_y).m_Ti;
  local_40 = ((dVar3 + (this->m_filter_int_vdv_y).super_ChAnalogueFilter.m_u_old) *
             (this->m_filter_int_vdv_y).super_ChAnalogueFilter.m_step) / (dVar1 + dVar1) +
             (this->m_filter_int_vdv_y).super_ChAnalogueFilter.m_y_old;
  (this->m_filter_int_vdv_y).super_ChAnalogueFilter.m_y_old = local_40;
  (this->m_filter_int_vdv_y).super_ChAnalogueFilter.m_u_old = dVar3;
  iVar2._M_current =
       (this->m_data_vdv_y_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_data_vdv_y_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->m_data_vdv_y_i,iVar2,&local_40);
  }
  else {
    *iVar2._M_current = local_40;
    (this->m_data_vdv_y_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  dVar3 = pow((this->m_data_acc_z_wk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish[-1],4.0);
  dVar1 = (this->m_filter_int_vdv_z).m_Ti;
  local_40 = ((dVar3 + (this->m_filter_int_vdv_z).super_ChAnalogueFilter.m_u_old) *
             (this->m_filter_int_vdv_z).super_ChAnalogueFilter.m_step) / (dVar1 + dVar1) +
             (this->m_filter_int_vdv_z).super_ChAnalogueFilter.m_y_old;
  (this->m_filter_int_vdv_z).super_ChAnalogueFilter.m_y_old = local_40;
  (this->m_filter_int_vdv_z).super_ChAnalogueFilter.m_u_old = dVar3;
  iVar2._M_current =
       (this->m_data_vdv_z_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_data_vdv_z_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              (&this->m_data_vdv_z_i,iVar2,&local_40);
  }
  else {
    *iVar2._M_current = local_40;
    (this->m_data_vdv_z_i).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  iVar2._M_current =
       (this->m_data_aw_x_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->m_data_aw_x_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_40 = 0.0;
    if (iVar2._M_current ==
        (this->m_data_aw_x_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->m_data_aw_x_avg,iVar2,&local_40);
    }
    else {
      *iVar2._M_current = 0.0;
      (this->m_data_aw_x_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_40 = 0.0;
    iVar2._M_current =
         (this->m_data_aw_y_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_data_aw_y_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->m_data_aw_y_avg,iVar2,&local_40);
    }
    else {
      *iVar2._M_current = 0.0;
      (this->m_data_aw_y_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_40 = 0.0;
    iVar2._M_current =
         (this->m_data_aw_z_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_data_aw_z_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->m_data_aw_z_avg,iVar2,&local_40);
    }
    else {
      *iVar2._M_current = 0.0;
      (this->m_data_aw_z_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_40 = 0.0;
    iVar2._M_current =
         (this->m_data_vdv_x_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_data_vdv_x_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->m_data_vdv_x_avg,iVar2,&local_40);
    }
    else {
      *iVar2._M_current = 0.0;
      (this->m_data_vdv_x_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_40 = 0.0;
    iVar2._M_current =
         (this->m_data_vdv_y_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_data_vdv_y_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->m_data_vdv_y_avg,iVar2,&local_40);
    }
    else {
      *iVar2._M_current = 0.0;
      (this->m_data_vdv_y_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_40 = 0.0;
    iVar2._M_current =
         (this->m_data_vdv_z_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_data_vdv_z_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) goto LAB_00954952;
    *iVar2._M_current = 0.0;
  }
  else {
    auVar4._0_8_ = (this->m_data_aw_x_i).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_finish[-1] / this->m_logging_time;
    auVar4._8_8_ = 0;
    if (auVar4._0_8_ < 0.0) {
      local_40 = sqrt(auVar4._0_8_);
    }
    else {
      auVar4 = vsqrtsd_avx(auVar4,auVar4);
      local_40 = auVar4._0_8_;
    }
    iVar2._M_current =
         (this->m_data_aw_x_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_data_aw_x_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->m_data_aw_x_avg,iVar2,&local_40);
    }
    else {
      *iVar2._M_current = local_40;
      (this->m_data_aw_x_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    auVar5._0_8_ = (this->m_data_aw_y_i).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_finish[-1] / this->m_logging_time;
    auVar5._8_8_ = 0;
    if (auVar5._0_8_ < 0.0) {
      local_40 = sqrt(auVar5._0_8_);
    }
    else {
      auVar4 = vsqrtsd_avx(auVar5,auVar5);
      local_40 = auVar4._0_8_;
    }
    iVar2._M_current =
         (this->m_data_aw_y_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_data_aw_y_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->m_data_aw_y_avg,iVar2,&local_40);
    }
    else {
      *iVar2._M_current = local_40;
      (this->m_data_aw_y_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    auVar6._0_8_ = (this->m_data_aw_z_i).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_finish[-1] / this->m_logging_time;
    auVar6._8_8_ = 0;
    if (auVar6._0_8_ < 0.0) {
      local_40 = sqrt(auVar6._0_8_);
    }
    else {
      auVar4 = vsqrtsd_avx(auVar6,auVar6);
      local_40 = auVar4._0_8_;
    }
    iVar2._M_current =
         (this->m_data_aw_z_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_data_aw_z_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->m_data_aw_z_avg,iVar2,&local_40);
    }
    else {
      *iVar2._M_current = local_40;
      (this->m_data_aw_z_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_40 = pow((this->m_data_vdv_x_i).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1] / this->m_logging_time,0.25);
    iVar2._M_current =
         (this->m_data_vdv_x_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_data_vdv_x_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->m_data_vdv_x_avg,iVar2,&local_40);
    }
    else {
      *iVar2._M_current = local_40;
      (this->m_data_vdv_x_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_40 = pow((this->m_data_vdv_y_i).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1] / this->m_logging_time,0.25);
    iVar2._M_current =
         (this->m_data_vdv_y_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_data_vdv_y_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->m_data_vdv_y_avg,iVar2,&local_40);
    }
    else {
      *iVar2._M_current = local_40;
      (this->m_data_vdv_y_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar2._M_current + 1;
    }
    local_40 = pow((this->m_data_vdv_z_i).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_finish[-1] / this->m_logging_time,0.25);
    iVar2._M_current =
         (this->m_data_vdv_z_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (this->m_data_vdv_z_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
LAB_00954952:
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&this->m_data_vdv_z_avg,iVar2,&local_40);
      goto LAB_00954963;
    }
    *iVar2._M_current = local_40;
  }
  (this->m_data_vdv_z_avg).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = iVar2._M_current + 1;
LAB_00954963:
  this->m_logging_time = this->m_step + this->m_logging_time;
  return;
}

Assistant:

void ChISO2631_Vibration_SeatCushionLogger::AddData(double speed, double acc_x, double acc_y, double acc_z) {
    const double meter_to_ft = 3.280839895;
    double startFactor = ChSineStep(m_logging_time, m_tstart1, 0.0, m_tstart2, 1.0);

    m_data_speed.push_back(speed);

    m_data_acc_x.push_back(startFactor * acc_x);
    m_data_acc_y.push_back(startFactor * acc_y);
    m_data_acc_z.push_back(startFactor * acc_z);

    m_data_acc_ap_z.push_back(startFactor * acc_z * meter_to_ft);

    m_data_acc_x_wd.push_back(m_filter_wd_x.Filter(m_data_acc_x.back()));
    m_data_acc_y_wd.push_back(m_filter_wd_y.Filter(m_data_acc_y.back()));
    m_data_acc_z_wk.push_back(m_filter_wk_z.Filter(m_data_acc_z.back()));

    m_data_aw_x_i.push_back(m_filter_int_aw_x.Filter(pow(m_data_acc_x_wd.back(), 2.0)));
    m_data_aw_y_i.push_back(m_filter_int_aw_y.Filter(pow(m_data_acc_y_wd.back(), 2.0)));
    m_data_aw_z_i.push_back(m_filter_int_aw_z.Filter(pow(m_data_acc_z_wk.back(), 2.0)));

    m_data_vdv_x_i.push_back(m_filter_int_vdv_x.Filter(pow(m_data_acc_x_wd.back(), 4.0)));
    m_data_vdv_y_i.push_back(m_filter_int_vdv_y.Filter(pow(m_data_acc_y_wd.back(), 4.0)));
    m_data_vdv_z_i.push_back(m_filter_int_vdv_z.Filter(pow(m_data_acc_z_wk.back(), 4.0)));

    if (m_data_aw_x_avg.size() == 0) {
        m_data_aw_x_avg.push_back(0.0);
        m_data_aw_y_avg.push_back(0.0);
        m_data_aw_z_avg.push_back(0.0);

        m_data_vdv_x_avg.push_back(0.0);
        m_data_vdv_y_avg.push_back(0.0);
        m_data_vdv_z_avg.push_back(0.0);
    } else {
        m_data_aw_x_avg.push_back(sqrt(m_data_aw_x_i.back() / m_logging_time));
        m_data_aw_y_avg.push_back(sqrt(m_data_aw_y_i.back() / m_logging_time));
        m_data_aw_z_avg.push_back(sqrt(m_data_aw_z_i.back() / m_logging_time));

        m_data_vdv_x_avg.push_back(pow(m_data_vdv_x_i.back() / m_logging_time, 0.25));
        m_data_vdv_y_avg.push_back(pow(m_data_vdv_y_i.back() / m_logging_time, 0.25));
        m_data_vdv_z_avg.push_back(pow(m_data_vdv_z_i.back() / m_logging_time, 0.25));
    }

    m_logging_time += m_step;
}